

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-run.c
# Opt level: O2

ztresult_t
zt_run_program(ztast_t *ast,ztstruct_t *metastruct,ztregion_t *regions,int nregions,
              ztloader_t **loaders,int nloaders,void *structure,char *errbuf)

{
  ztresult_t zVar1;
  char *unaff_retaddr;
  
  if (ast->program != (ztast_program_t *)0x0) {
    zVar1 = zt_run_statements(ast->program->statements,metastruct,regions,nregions,loaders,
                              (int)structure,errbuf,unaff_retaddr);
    return zVar1;
  }
  return 0x40;
}

Assistant:

ztresult_t zt_run_program(const ztast_t     *ast,
                          const ztstruct_t  *metastruct,
                          const ztregion_t  *regions,
                          int                nregions,
                          ztloader_t       **loaders,
                          int                nloaders,
                          void              *structure,
                          char              *errbuf)
{
  if (ast->program == NULL)
    return ztresult_NO_PROGRAM;

  return zt_run_statements(ast->program->statements,
                           metastruct,
                           regions,
                           nregions,
                           loaders,
                           nloaders,
                           structure,
                           errbuf);
}